

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_mysql.cpp
# Opt level: O2

QVariant * __thiscall QMYSQLResult::handle(QVariant *__return_storage_ptr__,QMYSQLResult *this)

{
  long lVar1;
  MYSQL_STMT **in_RDX;
  QVariant *this_00;
  
  lVar1 = *(long *)&this->field_0x8;
  if (*(char *)(lVar1 + 0xfd) == '\x01') {
    if (*(long *)(lVar1 + 0xe0) == 0) {
      QVariant::fromValue<MYSQL_STMT*>(__return_storage_ptr__,(QVariant *)(lVar1 + 0xd8),in_RDX);
      return __return_storage_ptr__;
    }
    this_00 = (QVariant *)(lVar1 + 0xe0);
  }
  else {
    this_00 = (QVariant *)(lVar1 + 0xb0);
  }
  QVariant::fromValue<MYSQL_RES*>(__return_storage_ptr__,this_00,(MYSQL_RES **)in_RDX);
  return __return_storage_ptr__;
}

Assistant:

QVariant QMYSQLResult::handle() const
{
    Q_D(const QMYSQLResult);
    if (d->preparedQuery)
        return d->meta ? QVariant::fromValue(d->meta) : QVariant::fromValue(d->stmt);
    else
        return QVariant::fromValue(d->result);
}